

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetB.c
# Opt level: O0

void point_mul_two(uchar *outx,uchar *outy,uchar *a,uchar *b,uchar *inx,uchar *iny)

{
  pt_aff_t_conflict4 P;
  uint8_t *in_stack_000002c0;
  uint64_t *in_stack_000002c8;
  uint64_t *in_stack_00000428;
  uint8_t *in_stack_00000430;
  pt_aff_t_conflict4 *in_stack_00001848;
  uchar *in_stack_00001850;
  uchar *in_stack_00001858;
  pt_aff_t_conflict4 *in_stack_00001860;
  
  fiat_id_tc26_gost_3410_2012_512_paramSetC_from_bytes(in_stack_000002c8,in_stack_000002c0);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_from_bytes(in_stack_000002c8,in_stack_000002c0);
  var_smul_wnaf_two(in_stack_00001860,in_stack_00001858,in_stack_00001850,in_stack_00001848);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_to_bytes(in_stack_00000430,in_stack_00000428);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_to_bytes(in_stack_00000430,in_stack_00000428);
  return;
}

Assistant:

static void point_mul_two(unsigned char outx[64], unsigned char outy[64],
                          const unsigned char a[64], const unsigned char b[64],
                          const unsigned char inx[64],
                          const unsigned char iny[64]) {
    pt_aff_t P;

    fiat_id_tc26_gost_3410_2012_512_paramSetB_from_bytes(P.X, inx);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_from_bytes(P.Y, iny);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_to_montgomery(P.X, P.X);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_to_montgomery(P.Y, P.Y);
    /* simultaneous scalar multiplication */
    var_smul_wnaf_two(&P, a, b, &P);

    fiat_id_tc26_gost_3410_2012_512_paramSetB_from_montgomery(P.X, P.X);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_from_montgomery(P.Y, P.Y);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_to_bytes(outx, P.X);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_to_bytes(outy, P.Y);
}